

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

void __thiscall anon_func::ReadUpdater::~ReadUpdater(ReadUpdater *this)

{
  ::wasm::WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>::~WalkerPass
            (&this->
              super_WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>);
  operator_delete(this,0x110);
  return;
}

Assistant:

void updateInstructions(Module& wasm) {
    struct ReadUpdater : public WalkerPass<PostWalker<ReadUpdater>> {
      bool isFunctionParallel() override { return true; }

      // Only affects struct.gets.
      bool requiresNonNullableLocalFixups() override { return false; }

      TypeRefining& parent;

      ReadUpdater(TypeRefining& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<ReadUpdater>(parent);
      }

      void visitStructGet(StructGet* curr) {
        if (curr->ref->type == Type::unreachable || curr->ref->type.isNull()) {
          return;
        }

        auto oldType = curr->ref->type.getHeapType();
        auto newFieldType = parent.finalInfos[oldType][curr->index].getLUB();
        if (!Type::isSubType(newFieldType, curr->type)) {
          // This instruction is invalid, so it must be the result of the
          // situation described above: we ignored the read during our
          // inference, and optimized accordingly, and so now we must remove it
          // to keep the module validating. It doesn't matter what we emit here,
          // since there are no struct.new or struct.sets for this type, so this
          // code is logically unreachable.
          //
          // Note that we emit an unreachable here, which changes the type, and
          // so we should refinalize. However, we will be refinalizing later
          // anyhow in updateTypes, so there is no need.
          Builder builder(*getModule());
          replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                              builder.makeUnreachable()));
        }
      }
    };

    ReadUpdater updater(*this);
    updater.run(getPassRunner(), &wasm);
    updater.runOnModuleCode(getPassRunner(), &wasm);
  }